

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryIndexedTree.hpp
# Opt level: O3

void __thiscall
primesum::BinaryIndexedTree::init<primesum::BitSieve>
          (BinaryIndexedTree *this,BitSieve *sieve,int64_t low)

{
  ulong uVar1;
  ulong uVar2;
  pointer puVar3;
  pointer p_Var4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong uVar10;
  bool bVar11;
  
  uVar5 = sieve->size_ >> 1;
  this->size_ = uVar5;
  std::vector<__int128,_std::allocator<__int128>_>::resize(&this->tree_,uVar5);
  uVar5 = this->size_;
  if (0 < (long)uVar5) {
    puVar3 = (sieve->sieve_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    p_Var4 = (this->tree_).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      uVar7 = (&BitSieve::set_bit_)[(int)uVar6 * 2 & 0x7e] & puVar3[uVar6 >> 6];
      if (uVar7 != 0) {
        uVar7 = low + uVar6 * 2;
      }
      uVar8 = (long)uVar7 >> 0x3f;
      *(ulong *)(p_Var4 + uVar6) = uVar7;
      *(ulong *)((long)p_Var4 + uVar6 * 0x10 + 8) = uVar8;
      uVar1 = uVar6 + 1;
      if (1 < (~uVar6 & uVar1)) {
        puVar9 = (ulong *)(p_Var4 + uVar6);
        uVar10 = ~uVar6 & uVar1;
        do {
          uVar2 = uVar6 - 1;
          bVar11 = CARRY8(uVar7,*(ulong *)(p_Var4 + uVar2));
          uVar7 = uVar7 + *(ulong *)(p_Var4 + uVar2);
          uVar8 = uVar8 + *(long *)((long)p_Var4 + uVar2 * 0x10 + 8) + (ulong)bVar11;
          *puVar9 = uVar7;
          puVar9[1] = uVar8;
          uVar6 = uVar6 & uVar2;
          bVar11 = 3 < uVar10;
          uVar10 = uVar10 >> 1;
        } while (bVar11);
      }
      uVar6 = uVar1;
    } while (uVar1 != uVar5);
  }
  return;
}

Assistant:

void init(const T& sieve, int64_t low)
  {
    size_ = sieve.size() / 2;
    tree_.resize(size_);

    for (int64_t i = 0; i < size_; i++)
    {
      int64_t i2 = i * 2;
      tree_[i] = (low + i2) * sieve[i2];
      int64_t k = (i + 1) & ~i;
      for (int64_t j = i; k >>= 1; j &= j - 1)
        tree_[i] += tree_[j - 1];
    }
  }